

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCompositeConstruct(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  int32_t iVar3;
  Op OVar4;
  uint32_t uVar5;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *pvVar6;
  size_type sVar7;
  DiagnosticStream *pDVar8;
  DiagnosticStream local_1c70;
  DiagnosticStream local_1a98;
  DiagnosticStream local_18c0;
  uint32_t local_16e4;
  undefined1 local_16e0 [4];
  uint32_t operand_type_id_1;
  uint local_1504;
  Instruction *pIStack_1500;
  uint component_type_id_1;
  Instruction *result_type_inst_1;
  uint32_t local_131c;
  undefined1 local_1318 [4];
  uint32_t operand_type_id;
  uint local_113c;
  Instruction *pIStack_1138;
  uint component_type_id;
  Instruction *result_type_inst;
  uint32_t local_f54;
  uint32_t local_f50;
  uint32_t member_type;
  uint32_t operand_type_3;
  uint32_t operand_index_3;
  Instruction *local_d70;
  Instruction *struct_inst;
  uint32_t local_b8c;
  Op local_b88;
  uint32_t operand_type_2;
  uint32_t operand_index_2;
  uint32_t result_component_type_2;
  uint64_t local_9a8;
  uint64_t array_size;
  Instruction *size;
  Instruction *array_inst;
  uint32_t local_7b8;
  Op local_7b4;
  uint32_t operand_type_1;
  uint32_t operand_index_1;
  uint32_t local_5d8;
  uint32_t local_5d4;
  uint32_t result_component_type_1;
  uint32_t result_col_type;
  uint32_t result_num_cols;
  uint32_t result_num_rows;
  DiagnosticStream local_3f0;
  uint32_t local_218;
  Op local_214;
  uint32_t operand_type;
  uint32_t operand_index;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t given_component_count;
  uint32_t result_component_type;
  uint32_t num_result_components;
  Op result_opcode;
  uint32_t result_type;
  uint32_t num_operands;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _result_type = inst;
  inst_local = (Instruction *)_;
  pvVar6 = Instruction::operands(inst);
  sVar7 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar6);
  result_opcode = (Op)sVar7;
  num_result_components = Instruction::type_id(_result_type);
  result_component_type =
       ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,num_result_components);
  if (result_component_type == OpTypeVector) {
    given_component_count =
         ValidationState_t::GetDimension((ValidationState_t *)inst_local,num_result_components);
    local_34 = ValidationState_t::GetComponentType
                         ((ValidationState_t *)inst_local,num_result_components);
    local_38 = 0;
    if (result_opcode < OpSourceExtension) {
      ValidationState_t::diag
                ((DiagnosticStream *)&operand_type,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&operand_type,
                          (char (*) [49])"Expected number of constituents to be at least 2");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&operand_type);
      return __local._4_4_;
    }
    for (local_214 = OpSourceContinued; local_214 < result_opcode; local_214 = local_214 + OpUndef)
    {
      local_218 = ValidationState_t::GetOperandTypeId
                            ((ValidationState_t *)inst_local,_result_type,(ulong)local_214);
      if (local_218 == local_34) {
        local_38 = local_38 + 1;
      }
      else {
        OVar4 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_218);
        if ((OVar4 != OpTypeVector) ||
           (uVar5 = ValidationState_t::GetComponentType((ValidationState_t *)inst_local,local_218),
           uVar5 != local_34)) {
          ValidationState_t::diag
                    (&local_3f0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type)
          ;
          pDVar8 = DiagnosticStream::operator<<
                             (&local_3f0,
                              (char (*) [50])"Expected Constituents to be scalars or vectors of");
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(char (*) [41])" the same type as Result Type components");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream(&local_3f0);
          return __local._4_4_;
        }
        uVar5 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_218);
        local_38 = uVar5 + local_38;
      }
    }
    if (given_component_count != local_38) {
      ValidationState_t::diag
                ((DiagnosticStream *)&result_num_cols,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&result_num_cols,
                          (char (*) [55])"Expected total number of given components to be equal ");
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(char (*) [34])"to the size of Result Type vector");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&result_num_cols);
      return __local._4_4_;
    }
  }
  else if (result_component_type == OpTypeMatrix) {
    result_col_type = 0;
    result_component_type_1 = 0;
    local_5d4 = 0;
    local_5d8 = 0;
    bVar2 = ValidationState_t::GetMatrixTypeInfo
                      ((ValidationState_t *)inst_local,num_result_components,&result_col_type,
                       &result_component_type_1,&local_5d4,&local_5d8);
    if (!bVar2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                    ,0x103,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                   );
    }
    if (result_component_type_1 + OpSourceContinued != result_opcode) {
      ValidationState_t::diag
                ((DiagnosticStream *)&operand_type_1,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&operand_type_1,
                          (char (*) [51])"Expected total number of Constituents to be equal ");
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(char (*) [47])"to the number of columns of Result Type matrix");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&operand_type_1);
      return __local._4_4_;
    }
    for (local_7b4 = OpSourceContinued; local_7b4 < result_opcode; local_7b4 = local_7b4 + OpUndef)
    {
      local_7b8 = ValidationState_t::GetOperandTypeId
                            ((ValidationState_t *)inst_local,_result_type,(ulong)local_7b4);
      if (local_7b8 != local_5d4) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&array_inst,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,_result_type);
        pDVar8 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&array_inst,
                            (char (*) [53])"Expected Constituent type to be equal to the column ");
        pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [24])"type Result Type matrix");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&array_inst);
        return __local._4_4_;
      }
    }
  }
  else if (result_component_type == OpTypeArray) {
    size = ValidationState_t::FindDef((ValidationState_t *)inst_local,num_result_components);
    if (size == (Instruction *)0x0) {
      __assert_fail("array_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                    ,0x11a,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                   );
    }
    OVar4 = Instruction::opcode(size);
    pIVar1 = inst_local;
    if (OVar4 != OpTypeArray) {
      __assert_fail("array_inst->opcode() == spv::Op::OpTypeArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                    ,0x11b,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                   );
    }
    uVar5 = Instruction::word(size,3);
    array_size = (uint64_t)ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar5);
    OVar4 = Instruction::opcode((Instruction *)array_size);
    iVar3 = spvOpcodeIsSpecConstant(OVar4);
    pIVar1 = inst_local;
    if (iVar3 == 0) {
      local_9a8 = 0;
      uVar5 = Instruction::word(size,3);
      bVar2 = ValidationState_t::EvalConstantValUint64((ValidationState_t *)pIVar1,uVar5,&local_9a8)
      ;
      if (!bVar2) {
        __assert_fail("0 && \"Array type definition is corrupt\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x125,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if (local_9a8 + 2 != (ulong)result_opcode) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&operand_index_2,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,_result_type);
        pDVar8 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&operand_index_2,
                            (char (*) [51])"Expected total number of Constituents to be equal ");
        pDVar8 = DiagnosticStream::operator<<
                           (pDVar8,(char (*) [47])"to the number of elements of Result Type array");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&operand_index_2);
        return __local._4_4_;
      }
      operand_type_2 = Instruction::word(size,2);
      for (local_b88 = OpSourceContinued; local_b88 < result_opcode; local_b88 = local_b88 + OpUndef
          ) {
        local_b8c = ValidationState_t::GetOperandTypeId
                              ((ValidationState_t *)inst_local,_result_type,(ulong)local_b88);
        if (local_b8c != operand_type_2) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&struct_inst,(ValidationState_t *)inst_local,
                     SPV_ERROR_INVALID_DATA,_result_type);
          pDVar8 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&struct_inst,
                              (char (*) [53])"Expected Constituent type to be equal to the column ")
          ;
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [23])"type Result Type array");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&struct_inst);
          return __local._4_4_;
        }
      }
    }
  }
  else if (result_component_type == OpTypeStruct) {
    local_d70 = ValidationState_t::FindDef((ValidationState_t *)inst_local,num_result_components);
    if (local_d70 == (Instruction *)0x0) {
      __assert_fail("struct_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                    ,0x13d,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                   );
    }
    OVar4 = Instruction::opcode(local_d70);
    if (OVar4 != OpTypeStruct) {
      __assert_fail("struct_inst->opcode() == spv::Op::OpTypeStruct",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                    ,0x13e,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                   );
    }
    pvVar6 = Instruction::operands(local_d70);
    sVar7 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar6);
    if (sVar7 + 1 != (ulong)result_opcode) {
      ValidationState_t::diag
                ((DiagnosticStream *)&operand_type_3,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&operand_type_3,
                          (char (*) [51])"Expected total number of Constituents to be equal ");
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(char (*) [47])"to the number of members of Result Type struct");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&operand_type_3);
      return __local._4_4_;
    }
    for (member_type = 2; member_type < result_opcode; member_type = member_type + 1) {
      local_f50 = ValidationState_t::GetOperandTypeId
                            ((ValidationState_t *)inst_local,_result_type,(ulong)member_type);
      local_f54 = Instruction::word(local_d70,(ulong)member_type);
      if (local_f50 != local_f54) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&result_type_inst,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,_result_type);
        pDVar8 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&result_type_inst,
                            (char (*) [46])"Expected Constituent type to be equal to the ");
        pDVar8 = DiagnosticStream::operator<<
                           (pDVar8,(char (*) [48])"corresponding member type of Result Type struct")
        ;
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&result_type_inst);
        return __local._4_4_;
      }
    }
  }
  else if (result_component_type == OpTypeCooperativeMatrixKHR) {
    pIStack_1138 = ValidationState_t::FindDef((ValidationState_t *)inst_local,num_result_components)
    ;
    if (pIStack_1138 == (Instruction *)0x0) {
      __assert_fail("result_type_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                    ,0x155,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                   );
    }
    local_113c = Instruction::GetOperandAs<unsigned_int>(pIStack_1138,1);
    if (result_opcode != OpSource) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_1318,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_1318,
                          (char (*) [29])"Must be only one constituent");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1318);
      return __local._4_4_;
    }
    local_131c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,2)
    ;
    if (local_131c != local_113c) {
      ValidationState_t::diag
                ((DiagnosticStream *)&result_type_inst_1,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&result_type_inst_1,
                          (char (*) [60])
                          "Expected Constituent type to be equal to the component type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&result_type_inst_1);
      return __local._4_4_;
    }
  }
  else {
    if (result_component_type != OpTypeCooperativeMatrixNV) {
      ValidationState_t::diag
                (&local_1a98,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_1a98,(char (*) [44])"Expected Result Type to be a composite type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_1a98);
      return __local._4_4_;
    }
    pIStack_1500 = ValidationState_t::FindDef((ValidationState_t *)inst_local,num_result_components)
    ;
    if (pIStack_1500 == (Instruction *)0x0) {
      __assert_fail("result_type_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                    ,0x168,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                   );
    }
    local_1504 = Instruction::GetOperandAs<unsigned_int>(pIStack_1500,1);
    if (result_opcode != OpSource) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_16e0,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_16e0,
                          (char (*) [28])"Expected single constituent");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_16e0);
      return __local._4_4_;
    }
    local_16e4 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,2)
    ;
    if (local_16e4 != local_1504) {
      ValidationState_t::diag
                (&local_18c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_18c0,
                          (char (*) [60])
                          "Expected Constituent type to be equal to the component type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_18c0);
      return __local._4_4_;
    }
  }
  bVar2 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader);
  pIVar1 = inst_local;
  if (bVar2) {
    uVar5 = Instruction::type_id(_result_type);
    bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType((ValidationState_t *)pIVar1,uVar5);
    if (bVar2) {
      ValidationState_t::diag
                (&local_1c70,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_1c70,
                          (char (*) [56])"Cannot create a composite containing 8- or 16-bit types");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_1c70);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateCompositeConstruct(ValidationState_t& _,
                                        const Instruction* inst) {
  const uint32_t num_operands = static_cast<uint32_t>(inst->operands().size());
  const uint32_t result_type = inst->type_id();
  const spv::Op result_opcode = _.GetIdOpcode(result_type);
  switch (result_opcode) {
    case spv::Op::OpTypeVector: {
      const uint32_t num_result_components = _.GetDimension(result_type);
      const uint32_t result_component_type = _.GetComponentType(result_type);
      uint32_t given_component_count = 0;

      if (num_operands <= 3) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected number of constituents to be at least 2";
      }

      for (uint32_t operand_index = 2; operand_index < num_operands;
           ++operand_index) {
        const uint32_t operand_type = _.GetOperandTypeId(inst, operand_index);
        if (operand_type == result_component_type) {
          ++given_component_count;
        } else {
          if (_.GetIdOpcode(operand_type) != spv::Op::OpTypeVector ||
              _.GetComponentType(operand_type) != result_component_type) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << "Expected Constituents to be scalars or vectors of"
                   << " the same type as Result Type components";
          }

          given_component_count += _.GetDimension(operand_type);
        }
      }

      if (num_result_components != given_component_count) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected total number of given components to be equal "
               << "to the size of Result Type vector";
      }

      break;
    }
    case spv::Op::OpTypeMatrix: {
      uint32_t result_num_rows = 0;
      uint32_t result_num_cols = 0;
      uint32_t result_col_type = 0;
      uint32_t result_component_type = 0;
      if (!_.GetMatrixTypeInfo(result_type, &result_num_rows, &result_num_cols,
                               &result_col_type, &result_component_type)) {
        assert(0);
      }

      if (result_num_cols + 2 != num_operands) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected total number of Constituents to be equal "
               << "to the number of columns of Result Type matrix";
      }

      for (uint32_t operand_index = 2; operand_index < num_operands;
           ++operand_index) {
        const uint32_t operand_type = _.GetOperandTypeId(inst, operand_index);
        if (operand_type != result_col_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Expected Constituent type to be equal to the column "
                 << "type Result Type matrix";
        }
      }

      break;
    }
    case spv::Op::OpTypeArray: {
      const Instruction* const array_inst = _.FindDef(result_type);
      assert(array_inst);
      assert(array_inst->opcode() == spv::Op::OpTypeArray);

      auto size = _.FindDef(array_inst->word(3));
      if (spvOpcodeIsSpecConstant(size->opcode())) {
        // Cannot verify against the size of this array.
        break;
      }

      uint64_t array_size = 0;
      if (!_.EvalConstantValUint64(array_inst->word(3), &array_size)) {
        assert(0 && "Array type definition is corrupt");
      }

      if (array_size + 2 != num_operands) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected total number of Constituents to be equal "
               << "to the number of elements of Result Type array";
      }

      const uint32_t result_component_type = array_inst->word(2);
      for (uint32_t operand_index = 2; operand_index < num_operands;
           ++operand_index) {
        const uint32_t operand_type = _.GetOperandTypeId(inst, operand_index);
        if (operand_type != result_component_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Expected Constituent type to be equal to the column "
                 << "type Result Type array";
        }
      }

      break;
    }
    case spv::Op::OpTypeStruct: {
      const Instruction* const struct_inst = _.FindDef(result_type);
      assert(struct_inst);
      assert(struct_inst->opcode() == spv::Op::OpTypeStruct);

      if (struct_inst->operands().size() + 1 != num_operands) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected total number of Constituents to be equal "
               << "to the number of members of Result Type struct";
      }

      for (uint32_t operand_index = 2; operand_index < num_operands;
           ++operand_index) {
        const uint32_t operand_type = _.GetOperandTypeId(inst, operand_index);
        const uint32_t member_type = struct_inst->word(operand_index);
        if (operand_type != member_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Expected Constituent type to be equal to the "
                 << "corresponding member type of Result Type struct";
        }
      }

      break;
    }
    case spv::Op::OpTypeCooperativeMatrixKHR: {
      const auto result_type_inst = _.FindDef(result_type);
      assert(result_type_inst);
      const auto component_type_id =
          result_type_inst->GetOperandAs<uint32_t>(1);

      if (3 != num_operands) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Must be only one constituent";
      }

      const uint32_t operand_type_id = _.GetOperandTypeId(inst, 2);

      if (operand_type_id != component_type_id) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Constituent type to be equal to the component type";
      }
      break;
    }
    case spv::Op::OpTypeCooperativeMatrixNV: {
      const auto result_type_inst = _.FindDef(result_type);
      assert(result_type_inst);
      const auto component_type_id =
          result_type_inst->GetOperandAs<uint32_t>(1);

      if (3 != num_operands) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected single constituent";
      }

      const uint32_t operand_type_id = _.GetOperandTypeId(inst, 2);

      if (operand_type_id != component_type_id) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Constituent type to be equal to the component type";
      }

      break;
    }
    default: {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Result Type to be a composite type";
    }
  }

  if (_.HasCapability(spv::Capability::Shader) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Cannot create a composite containing 8- or 16-bit types";
  }
  return SPV_SUCCESS;
}